

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O1

String * Rml::StringUtilities::EncodeRml(String *__return_storage_ptr__,String *string)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  size_type sVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  sVar2 = string->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (string->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      bVar1 = pcVar3[sVar4];
      if (bVar1 < 0x3c) {
        if ((bVar1 != 0x22) && (bVar1 != 0x26)) goto LAB_00267885;
LAB_00267899:
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        if ((bVar1 == 0x3e) || (bVar1 == 0x3c)) goto LAB_00267899;
LAB_00267885:
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

RMLUICORE_API String StringUtilities::EncodeRml(const String& string)
{
	String result;
	result.reserve(string.size());
	for (char c : string)
	{
		switch (c)
		{
		case '<': result += "&lt;"; break;
		case '>': result += "&gt;"; break;
		case '&': result += "&amp;"; break;
		case '"': result += "&quot;"; break;
		default: result += c; break;
		}
	}
	return result;
}